

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts3EvalTokenCosts(Fts3Cursor *pCsr,Fts3Expr *pRoot,Fts3Expr *pExpr,Fts3TokenAndCost **ppTC,
                       Fts3Expr ***ppOr,int *pRc)

{
  Fts3Phrase *pFVar1;
  Fts3TokenAndCost *pFVar2;
  bool bVar3;
  int iVar4;
  Fts3TokenAndCost *pTC;
  int i;
  Fts3Phrase *pPhrase;
  int *pRc_local;
  Fts3Expr ***ppOr_local;
  Fts3TokenAndCost **ppTC_local;
  Fts3Expr *pExpr_local;
  Fts3Expr *pRoot_local;
  Fts3Cursor *pCsr_local;
  
  if (*pRc == 0) {
    if (pExpr->eType == 5) {
      pFVar1 = pExpr->pPhrase;
      pTC._4_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (*pRc == 0) {
          bVar3 = pTC._4_4_ < pFVar1->nToken;
        }
        if (!bVar3) break;
        pFVar2 = *ppTC;
        *ppTC = pFVar2 + 1;
        pFVar2->pPhrase = pFVar1;
        pFVar2->iToken = pTC._4_4_;
        pFVar2->pRoot = pRoot;
        pFVar2->pToken = pFVar1->aToken + pTC._4_4_;
        pFVar2->iCol = pFVar1->iColumn;
        iVar4 = sqlite3Fts3MsrOvfl(pCsr,pFVar2->pToken->pSegcsr,&pFVar2->nOvfl);
        *pRc = iVar4;
        pTC._4_4_ = pTC._4_4_ + 1;
      }
    }
    else if (pExpr->eType != 2) {
      pExpr_local = pRoot;
      if (pExpr->eType == 4) {
        pExpr_local = pExpr->pLeft;
        **ppOr = pExpr_local;
        *ppOr = *ppOr + 1;
      }
      fts3EvalTokenCosts(pCsr,pExpr_local,pExpr->pLeft,ppTC,ppOr,pRc);
      if (pExpr->eType == 4) {
        pExpr_local = pExpr->pRight;
        **ppOr = pExpr_local;
        *ppOr = *ppOr + 1;
      }
      fts3EvalTokenCosts(pCsr,pExpr_local,pExpr->pRight,ppTC,ppOr,pRc);
    }
  }
  return;
}

Assistant:

static void fts3EvalTokenCosts(
  Fts3Cursor *pCsr,               /* FTS Cursor handle */
  Fts3Expr *pRoot,                /* Root of current AND/NEAR cluster */
  Fts3Expr *pExpr,                /* Expression to consider */
  Fts3TokenAndCost **ppTC,        /* Write new entries to *(*ppTC)++ */
  Fts3Expr ***ppOr,               /* Write new OR root to *(*ppOr)++ */
  int *pRc                        /* IN/OUT: Error code */
){
  if( *pRc==SQLITE_OK ){
    if( pExpr->eType==FTSQUERY_PHRASE ){
      Fts3Phrase *pPhrase = pExpr->pPhrase;
      int i;
      for(i=0; *pRc==SQLITE_OK && i<pPhrase->nToken; i++){
        Fts3TokenAndCost *pTC = (*ppTC)++;
        pTC->pPhrase = pPhrase;
        pTC->iToken = i;
        pTC->pRoot = pRoot;
        pTC->pToken = &pPhrase->aToken[i];
        pTC->iCol = pPhrase->iColumn;
        *pRc = sqlite3Fts3MsrOvfl(pCsr, pTC->pToken->pSegcsr, &pTC->nOvfl);
      }
    }else if( pExpr->eType!=FTSQUERY_NOT ){
      assert( pExpr->eType==FTSQUERY_OR
           || pExpr->eType==FTSQUERY_AND
           || pExpr->eType==FTSQUERY_NEAR
      );
      assert( pExpr->pLeft && pExpr->pRight );
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pLeft;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pLeft, ppTC, ppOr, pRc);
      if( pExpr->eType==FTSQUERY_OR ){
        pRoot = pExpr->pRight;
        **ppOr = pRoot;
        (*ppOr)++;
      }
      fts3EvalTokenCosts(pCsr, pRoot, pExpr->pRight, ppTC, ppOr, pRc);
    }
  }
}